

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.h
# Opt level: O0

void __thiscall
xmrig::SelfSelectClient::onClose(SelfSelectClient *this,IClient *param_2,int failures)

{
  State in_EDX;
  SelfSelectClient *in_RSI;
  long in_RDI;
  
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),in_RDI,in_EDX);
  setState(in_RSI,in_EDX);
  *(undefined1 *)(in_RDI + 0x18) = 0;
  return;
}

Assistant:

inline void onClose(IClient *, int failures) override                                           { m_listener->onClose(this, failures); setState(IdleState); m_active = false; }